

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O0

void __thiscall chrono::ChArchiveOut::~ChArchiveOut(ChArchiveOut *this)

{
  ChArchiveOut *this_local;
  
  (this->super_ChArchive)._vptr_ChArchive = (_func_int **)&PTR__ChArchiveOut_001c48f0;
  std::unordered_set<void_*,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<void_*>_>::
  ~unordered_set(&this->cut_pointers);
  std::
  unordered_map<void_*,_unsigned_long,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
  ::~unordered_map(&this->external_ptr_id);
  std::
  unordered_map<void_*,_unsigned_long,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
  ::~unordered_map(&this->internal_ptr_id);
  ChArchive::~ChArchive(&this->super_ChArchive);
  return;
}

Assistant:

virtual ~ChArchiveOut() {}